

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

optional<IndexType> index_type_from_string(string *type)

{
  bool bVar1;
  ulong uVar2;
  ulong uStack_20;
  
  uVar2 = 0x100000000;
  bVar1 = std::operator==(type,"gram3");
  if (bVar1) {
    uStack_20 = 1;
  }
  else {
    bVar1 = std::operator==(type,"text4");
    if (bVar1) {
      uStack_20 = 2;
    }
    else {
      bVar1 = std::operator==(type,"hash4");
      if (bVar1) {
        uStack_20 = 3;
      }
      else {
        bVar1 = std::operator==(type,"wide8");
        if (!bVar1) {
          uVar2 = 0;
        }
        uStack_20 = 4;
      }
    }
  }
  return (optional<IndexType>)(uStack_20 | uVar2);
}

Assistant:

std::optional<IndexType> index_type_from_string(const std::string &type) {
    if (type == "gram3") {
        return IndexType::GRAM3;
    }
    if (type == "text4") {
        return IndexType::TEXT4;
    }
    if (type == "hash4") {
        return IndexType::HASH4;
    }
    if (type == "wide8") {
        return IndexType::WIDE8;
    }
    return std::nullopt;
}